

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtpkeyhashtable.h
# Opt level: O0

int __thiscall
jrtplib::
RTPKeyHashTable<const_unsigned_int,_jrtplib::RTPInternalSourceData_*,_jrtplib::RTPSources_GetHashIndex,_8317>
::AddElement(RTPKeyHashTable<const_unsigned_int,_jrtplib::RTPInternalSourceData_*,_jrtplib::RTPSources_GetHashIndex,_8317>
             *this,uint *k,RTPInternalSourceData **elem)

{
  HashElement *pHVar1;
  bool bVar2;
  int index_00;
  uint *puVar3;
  RTPMemoryManager *mgr;
  HashElement *this_00;
  HashElement *newelem;
  HashElement *e;
  bool found;
  int index;
  RTPInternalSourceData **elem_local;
  uint *k_local;
  RTPKeyHashTable<const_unsigned_int,_jrtplib::RTPInternalSourceData_*,_jrtplib::RTPSources_GetHashIndex,_8317>
  *this_local;
  
  index_00 = RTPSources_GetHashIndex::GetIndex(k);
  if (index_00 < 0x207d) {
    newelem = this->table[index_00];
    bVar2 = false;
    while (!bVar2 && newelem != (HashElement *)0x0) {
      puVar3 = HashElement::GetKey(newelem);
      if (*puVar3 == *k) {
        bVar2 = true;
      }
      else {
        newelem = newelem->hashnext;
      }
    }
    if (bVar2) {
      this_local._4_4_ = -9;
    }
    else {
      mgr = RTPMemoryObject::GetMemoryManager(&this->super_RTPMemoryObject);
      this_00 = (HashElement *)operator_new(0x30,mgr,this->memorytype);
      HashElement::HashElement(this_00,k,elem,index_00);
      if (this_00 == (HashElement *)0x0) {
        this_local._4_4_ = -1;
      }
      else {
        pHVar1 = this->table[index_00];
        this->table[index_00] = this_00;
        this_00->hashnext = pHVar1;
        if (pHVar1 != (HashElement *)0x0) {
          pHVar1->hashprev = this_00;
        }
        if (this->firsthashelem == (HashElement *)0x0) {
          this->firsthashelem = this_00;
          this->lasthashelem = this_00;
        }
        else {
          this->lasthashelem->listnext = this_00;
          this_00->listprev = this->lasthashelem;
          this->lasthashelem = this_00;
        }
        this_local._4_4_ = 0;
      }
    }
  }
  else {
    this_local._4_4_ = -8;
  }
  return this_local._4_4_;
}

Assistant:

inline int RTPKeyHashTable<Key,Element,GetIndex,hashsize>::AddElement(const Key &k,const Element &elem)
{
	int index;
	bool found;
	HashElement *e,*newelem;
	
	index = GetIndex::GetIndex(k);
	if (index >= hashsize)
		return ERR_RTP_KEYHASHTABLE_FUNCTIONRETURNEDINVALIDHASHINDEX;
	
	e = table[index];
	found = false;
	while(!found && e != 0)
	{
		if (e->GetKey() == k)
			found = true;
		else
			e = e->hashnext;
	}
	if (found)
		return ERR_RTP_KEYHASHTABLE_KEYALREADYEXISTS;
	
	// Okay, the key doesn't exist, so we can add the new element in the hash table
	
	newelem = RTPNew(GetMemoryManager(),memorytype) HashElement(k,elem,index);
	if (newelem == 0)
		return ERR_RTP_OUTOFMEM;

	e = table[index];
	table[index] = newelem;
	newelem->hashnext = e;
	if (e != 0)
		e->hashprev = newelem;
	
	// Now, we still got to add it to the linked list
	
	if (firsthashelem == 0)
	{
		firsthashelem = newelem;
		lasthashelem = newelem;
	}
	else // there already are some elements in the list
	{
		lasthashelem->listnext = newelem;
		newelem->listprev = lasthashelem;
		lasthashelem = newelem;
	}
	return 0;
}